

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>>::
emplace_back<slang::ast::ValueSymbol*&,slang::ast::PortSymbol*&>
          (SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>> *this,
          ValueSymbol **args,PortSymbol **args_1)

{
  ulong uVar1;
  SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>> *p;
  undefined8 uVar2;
  SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>> *pSVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>> *__src;
  long lVar9;
  
  lVar6 = *(long *)this;
  lVar9 = *(long *)(this + 8);
  __src = (SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>> *)
          (lVar9 * 0x10 + lVar6);
  if (lVar9 != *(long *)(this + 0x10)) {
    *(ValueSymbol **)__src = *args;
    *(PortSymbol **)(__src + 8) = *args_1;
    *(long *)(this + 8) = lVar9 + 1;
    return (reference)(lVar6 + (lVar9 + 1) * 0x10 + -0x10);
  }
  if (*(long *)(this + 8) == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar8 = *(long *)(this + 8) + 1;
  uVar1 = *(ulong *)(this + 0x10);
  if (uVar8 < uVar1 * 2) {
    uVar8 = uVar1 * 2;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    uVar8 = 0x7ffffffffffffff;
  }
  lVar9 = (long)__src - *(long *)this;
  puVar5 = (undefined8 *)operator_new(uVar8 << 4);
  *(ValueSymbol **)((long)puVar5 + lVar9) = *args;
  *(PortSymbol **)((long)puVar5 + lVar9 + 8) = *args_1;
  p = *(SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>> **)this;
  lVar6 = *(long *)(this + 8) * 0x10;
  pSVar3 = p;
  puVar4 = puVar5;
  if (p + (lVar6 - (long)__src) ==
      (SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>> *)0x0) {
    if (*(long *)(this + 8) != 0) {
      lVar7 = 0;
      do {
        uVar2 = *(undefined8 *)(p + lVar7 + 8);
        *(undefined8 *)((long)puVar5 + lVar7) = *(undefined8 *)(p + lVar7);
        ((undefined8 *)((long)puVar5 + lVar7))[1] = uVar2;
        lVar7 = lVar7 + 0x10;
      } while (lVar6 != lVar7);
    }
  }
  else {
    for (; pSVar3 != __src; pSVar3 = pSVar3 + 0x10) {
      uVar2 = *(undefined8 *)(pSVar3 + 8);
      *puVar4 = *(undefined8 *)pSVar3;
      puVar4[1] = uVar2;
      puVar4 = puVar4 + 2;
    }
    memcpy((void *)((long)puVar5 + lVar9 + 0x10),__src,
           ((ulong)(p + (lVar6 - (long)__src) + -0x10) & 0xfffffffffffffff0) + 0x10);
  }
  if (p != this + 0x18) {
    operator_delete(p);
  }
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = uVar8;
  *(undefined8 **)this = puVar5;
  return (reference)((long)puVar5 + lVar9);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }